

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weight_constraint.cpp
# Opt level: O1

WeightConstraint *
Clasp::WeightConstraint::doCreate(Solver *s,Literal W,WeightLitsRep *rep,uint32 flags)

{
  uint uVar1;
  uint32 uVar2;
  Share SVar3;
  Solver *s_00;
  bool bVar4;
  bool bVar5;
  undefined4 *puVar6;
  uint32 act;
  uint uVar7;
  bool bVar8;
  SharedContext *ctx;
  int iVar9;
  uint uVar10;
  WL *out;
  uint uVar11;
  ulong uVar12;
  WeightConstraint *pWVar13;
  Result RVar14;
  Literal bin [2];
  LitVec clause;
  ulong local_68;
  uint local_60;
  Literal local_5c;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> local_58;
  ClauseRep local_48;
  Solver *local_38;
  
  act = 3;
  if (((flags & 0xc0) != 0) && ((flags & 0xc0) != 0xc0)) {
    act = flags >> 7 & 1;
  }
  uVar2 = rep->size;
  Solver::acquireProblemVar(s,W.rep_ >> 2);
  bVar4 = WeightLitsRep::propagate(rep,s,W);
  if (!bVar4) {
    return (WeightConstraint *)0x1;
  }
  iVar9 = rep->bound;
  if (rep->reach < iVar9) {
    return (WeightConstraint *)0x0;
  }
  if (iVar9 < 1 && ((byte)flags >> 2 & uVar2 != 0) == 0) {
    return (WeightConstraint *)0x0;
  }
  if ((iVar9 != 1 && iVar9 != rep->reach) || (act != 3 || (flags & 1) != 0)) {
    SVar3 = s->shared_->share_;
    local_60 = 0x18;
    if (((uint)SVar3 >> 0x19 & 1) == 0) {
      local_60 = ~(uint)SVar3 >> 0x10 & 0x10;
    }
    local_60 = local_60 | flags;
    uVar2 = rep->size;
    if (uVar2 == 0) {
      bVar4 = false;
    }
    else {
      bVar4 = 1 < rep->lits->second;
    }
    uVar7 = (uint)bVar4;
    uVar11 = uVar2 + 1;
    iVar9 = (uVar2 + uVar7 + 1) * 4;
    uVar1 = (uVar11 << bVar4) * 4 + 4;
    local_5c.rep_ = W.rep_;
    local_38 = s;
    if ((local_60 & 0x10) == 0) {
      pWVar13 = (WeightConstraint *)operator_new((ulong)(iVar9 + 0x20));
      puVar6 = (undefined4 *)operator_new((ulong)uVar1 + 4);
      LOCK();
      *puVar6 = 1;
      UNLOCK();
      puVar6[1] = (uVar11 & 0x3fffffff) + 0x40000000 + uVar7 * -0x80000000;
      out = (WL *)(puVar6 + 1);
    }
    else {
      uVar10 = iVar9 + 0x20;
      pWVar13 = (WeightConstraint *)operator_new((ulong)(uVar10 + uVar1));
      out = (WL *)((long)pWVar13->bound_ + ((ulong)uVar10 - 0x14));
      *(uint *)((long)pWVar13->bound_ + ((ulong)uVar10 - 0x14)) =
           uVar7 << 0x1f | uVar11 & 0x3fffffff;
    }
    s_00 = local_38;
    if ((local_60 & 8) == 0) {
      ctx = local_38->shared_;
    }
    else {
      ctx = (SharedContext *)0x0;
    }
    WeightConstraint(pWVar13,local_38,ctx,local_5c,rep,out,act);
    bVar4 = integrateRoot(pWVar13,s_00);
    if (bVar4) {
      if ((flags & 3) != 0) {
        return pWVar13;
      }
      Solver::add(s_00,&pWVar13->super_Constraint);
      return pWVar13;
    }
    (*(pWVar13->super_Constraint)._vptr_Constraint[5])(pWVar13,s_00,1);
    return (WeightConstraint *)0x1;
  }
  local_58.ebo_.buf = (pointer)0x0;
  local_58.ebo_.size = 0;
  local_58.ebo_.cap = 0;
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::reserve
            (&local_58,rep->size + 1);
  local_68 = 0;
  uVar1 = (uint)(rep->bound == 1) * 2;
  local_48.info.super_ConstraintScore.rep =
       (ConstraintScore)(ConstraintScore)(W.rep_ & 0xfffffffe ^ uVar1);
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
            (&local_58,(Literal *)&local_48);
  if (rep->size != 0) {
    uVar12 = 0;
    bVar4 = false;
    do {
      uVar11 = (local_58.ebo_.buf)->rep_;
      uVar7 = rep->lits[uVar12].first.rep_ & 0xfffffffe ^ uVar1;
      local_68 = CONCAT44(uVar7,uVar11) & 0xfffffffffffffffe ^ 2;
      bVar8 = true;
      if (1 < (uVar11 ^ uVar7)) {
        if (uVar7 != (uVar11 & 0xfffffffe ^ 2)) {
          local_48._0_8_ = CONCAT44(local_48._4_4_,uVar7) ^ 2;
          bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                    (&local_58,(Literal *)&local_48);
        }
        local_48._0_8_ = 0x200000000;
        local_48.lits = (Literal *)&local_68;
        bVar5 = Solver::add(s,&local_48,true);
        bVar8 = bVar4;
        if (!bVar5) {
          pWVar13 = (WeightConstraint *)0x1;
          goto LAB_0017aa82;
        }
      }
      uVar11 = (int)uVar12 + 1;
      uVar12 = (ulong)uVar11;
      bVar4 = bVar8;
    } while (uVar11 != rep->size);
    if (bVar8) {
      pWVar13 = (WeightConstraint *)0x0;
      goto LAB_0017aa82;
    }
  }
  local_48._0_8_ = local_48._0_8_ & 0xffffffff00000000;
  RVar14 = ClauseCreator::create(s,&local_58,0,&local_48.info);
  pWVar13 = (WeightConstraint *)(ulong)((RVar14.status & status_unsat) >> 1);
LAB_0017aa82:
  if (local_58.ebo_.buf != (pointer)0x0) {
    operator_delete(local_58.ebo_.buf);
  }
  return pWVar13;
}

Assistant:

WeightConstraint* WeightConstraint::doCreate(Solver& s, Literal W, WeightLitsRep& rep, uint32 flags) {
	WeightConstraint* conflict = (WeightConstraint*)0x1;
	const uint32 onlyOne = create_only_btb|create_only_bfb;
	uint32 act  = 3u;
	if ((flags & onlyOne) && (flags & onlyOne) != onlyOne) {
		act = (flags & create_only_bfb) != 0u;
	}
	bool addSat = (flags&create_sat) != 0 && rep.size;
	s.acquireProblemVar(W.var());
	if (!rep.propagate(s, W))                 { return conflict; }
	if (rep.unsat() || (rep.sat() && !addSat)){ return 0; }
	if ((rep.bound == 1 || rep.bound == rep.reach) && (flags & create_explicit) == 0 && act == 3u) {
		LitVec clause; clause.reserve(1 + rep.size);
		Literal bin[2];
		bool disj = rep.bound == 1; // con == disjunction or con == conjunction
		bool sat  = false;
		clause.push_back(W ^ disj);
		for (LitVec::size_type i = 0; i != rep.size; ++i) {
			bin[0] = ~clause[0];
			bin[1] = rep.lits[i].first ^ disj;
			if (bin[0] != ~bin[1]) {
				if (bin[0] != bin[1])                 { clause.push_back(~bin[1]); }
				if (!s.add(ClauseRep::create(bin, 2))){ return conflict; }
			}
			else { sat = true; }
		}
		return (sat || ClauseCreator::create(s, clause, 0)) ? 0 : conflict;
	}
	assert(rep.open() || (rep.sat() && addSat));
	if (!s.sharedContext()->physicalShareProblem()) { flags |= create_no_share; }
	if (s.sharedContext()->frozen())                { flags |= (create_no_freeze|create_no_share); }
	bool   hasW = rep.hasWeights();
	uint32 size = 1 + rep.size;
	uint32 nb   = sizeof(WeightConstraint) + (size+uint32(hasW))*sizeof(UndoInfo);
	uint32 wls  = sizeof(WL) + (size << uint32(hasW))*sizeof(Literal);
	void*  m    = 0;
	WL*    sL   = 0;
	if ((flags & create_no_share) != 0) {
		nb = ((nb + 3) / 4)*4;
		m  = ::operator new (nb + wls);
		sL = new (reinterpret_cast<unsigned char*>(m)+nb) WL(size, false, hasW);
	}
	else {
		static_assert(sizeof(RCType) == sizeof(uint32), "Invalid size!");
		m = ::operator new(nb);
		uint8* t = (uint8*)::operator new(wls + sizeof(uint32));
		*(new (t) RCType) = 1;
		sL = new (t+sizeof(uint32)) WL(size, true, hasW);
	}
	assert(m && (reinterpret_cast<uintp>(m) & 7u) == 0);
	SharedContext*  ctx = (flags & create_no_freeze) == 0 ? const_cast<SharedContext*>(s.sharedContext()) : 0;
	WeightConstraint* c = new (m) WeightConstraint(s, ctx, W, rep, sL, act);
	if (!c->integrateRoot(s)) {
		c->destroy(&s, true);
		return conflict;
	}
	if ((flags & create_no_add) == 0) { s.add(c); }
	return c;
}